

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

drwav * drwav_open_memory_write(void **ppData,size_t *pDataSize,drwav_data_format *pFormat)

{
  drwav *pdVar1;
  drwav__memory_stream_write memoryStreamWrite;
  void **local_28;
  size_t *psStack_20;
  size_t local_18;
  size_t sStack_10;
  size_t local_8;
  
  if (ppData != (void **)0x0) {
    *ppData = (void *)0x0;
    *pDataSize = 0;
    local_18 = 0;
    sStack_10 = 0;
    local_8 = 0;
    local_28 = ppData;
    psStack_20 = pDataSize;
    pdVar1 = drwav_open_write(pFormat,drwav__on_write_memory,drwav__on_seek_memory_write,&local_28);
    if (pdVar1 != (drwav *)0x0) {
      (pdVar1->memoryStreamWrite).currentWritePos = local_8;
      (pdVar1->memoryStreamWrite).dataSize = local_18;
      (pdVar1->memoryStreamWrite).dataCapacity = sStack_10;
      (pdVar1->memoryStreamWrite).ppData = local_28;
      (pdVar1->memoryStreamWrite).pDataSize = psStack_20;
      pdVar1->pUserData = &pdVar1->memoryStreamWrite;
    }
    return pdVar1;
  }
  return (drwav *)0x0;
}

Assistant:

drwav* drwav_open_memory_write(void** ppData, size_t* pDataSize, const drwav_data_format* pFormat) {
    if (ppData == NULL) {
        return NULL;
    }

    *ppData = NULL;  // Important because we're using realloc()!
    *pDataSize = 0;

    drwav__memory_stream_write memoryStreamWrite;
    drwav_zero_memory(&memoryStreamWrite, sizeof(memoryStreamWrite));
    memoryStreamWrite.ppData = ppData;
    memoryStreamWrite.pDataSize = pDataSize;
    memoryStreamWrite.dataSize = 0;
    memoryStreamWrite.dataCapacity = 0;
    memoryStreamWrite.currentWritePos = 0;

    drwav* pWav =
        drwav_open_write(pFormat, drwav__on_write_memory, drwav__on_seek_memory_write, (void*)&memoryStreamWrite);
    if (pWav == NULL) {
        return NULL;
    }

    pWav->memoryStreamWrite = memoryStreamWrite;
    pWav->pUserData = &pWav->memoryStreamWrite;
    return pWav;
}